

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AppendProperty(cmMakefile *this,string *prop,char *value,bool asString)

{
  cmListFileBacktrace lfbt;
  cmListFileBacktrace cStack_c8;
  cmListFileBacktrace local_88;
  Directory local_48;
  
  GetBacktrace(&local_88,this);
  cmState::Snapshot::GetDirectory(&local_48,&this->StateSnapshot);
  cmListFileBacktrace::cmListFileBacktrace(&cStack_c8,&local_88);
  cmState::Directory::AppendProperty(&local_48,prop,value,asString,&cStack_c8);
  cmListFileBacktrace::~cmListFileBacktrace(&cStack_c8);
  cmListFileBacktrace::~cmListFileBacktrace(&local_88);
  return;
}

Assistant:

void cmMakefile::AppendProperty(const std::string& prop,
                                const char* value,
                                bool asString)
{
  cmListFileBacktrace lfbt = this->GetBacktrace();
  this->StateSnapshot.GetDirectory().AppendProperty(prop, value,
                                                    asString, lfbt);
}